

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<QMakeLocalFileName*>,long_long>
               (reverse_iterator<QMakeLocalFileName_*> first,longlong n,
               reverse_iterator<QMakeLocalFileName_*> d_first)

{
  undefined8 uVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  int *piVar5;
  QMakeLocalFileName *pQVar6;
  QMakeLocalFileName *pQVar7;
  QMakeLocalFileName *pQVar8;
  QMakeLocalFileName *pQVar9;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (QMakeLocalFileName *)((d_first.current)->real_name).d.d;
  pQVar6 = local_38.end.current + -n;
  pQVar9 = (QMakeLocalFileName *)((first.current)->real_name).d.d;
  local_38.intermediate.current = local_38.end.current;
  pQVar7 = pQVar6;
  pQVar8 = pQVar9;
  if (pQVar6 < pQVar9) {
    pQVar7 = pQVar9;
    pQVar8 = pQVar6;
  }
  while (local_38.intermediate.current != pQVar7) {
    uVar1 = *(undefined8 *)&pQVar9[-1].real_name.d.d;
    *(undefined8 *)&pQVar9[-1].real_name.d.d = 0;
    *(undefined8 *)&local_38.intermediate.current[-1].real_name.d.d = uVar1;
    pcVar2 = pQVar9[-1].real_name.d.ptr;
    pQVar9[-1].real_name.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].real_name.d.ptr = pcVar2;
    qVar3 = pQVar9[-1].real_name.d.size;
    pQVar9[-1].real_name.d.size = 0;
    local_38.intermediate.current[-1].real_name.d.size = qVar3;
    pDVar4 = pQVar9[-1].local_name.d.d;
    pQVar9[-1].local_name.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].local_name.d.d = pDVar4;
    pcVar2 = pQVar9[-1].local_name.d.ptr;
    pQVar9[-1].local_name.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].local_name.d.ptr = pcVar2;
    qVar3 = pQVar9[-1].local_name.d.size;
    pQVar9[-1].local_name.d.size = 0;
    local_38.intermediate.current[-1].local_name.d.size = qVar3;
    ((d_first.current)->real_name).d.d = ((d_first.current)->real_name).d.d + -3;
    pQVar9 = (QMakeLocalFileName *)(((first.current)->real_name).d.d + -3);
    ((first.current)->real_name).d.d = (Data *)pQVar9;
    local_38.intermediate.current = (QMakeLocalFileName *)((d_first.current)->real_name).d.d;
  }
  local_38.iter = &local_38.end;
  pQVar7 = local_38.intermediate.current;
  while (pQVar7 != pQVar6) {
    uVar1 = *(undefined8 *)&pQVar7[-1].real_name.d.d;
    *(undefined8 *)&pQVar7[-1].real_name.d.d = *(undefined8 *)&pQVar9[-1].real_name.d.d;
    *(undefined8 *)&pQVar9[-1].real_name.d.d = uVar1;
    pcVar2 = pQVar7[-1].real_name.d.ptr;
    pQVar7[-1].real_name.d.ptr = pQVar9[-1].real_name.d.ptr;
    pQVar9[-1].real_name.d.ptr = pcVar2;
    qVar3 = pQVar7[-1].real_name.d.size;
    pQVar7[-1].real_name.d.size = pQVar9[-1].real_name.d.size;
    pQVar9[-1].real_name.d.size = qVar3;
    pDVar4 = pQVar7[-1].local_name.d.d;
    pQVar7[-1].local_name.d.d = pQVar9[-1].local_name.d.d;
    pQVar9[-1].local_name.d.d = pDVar4;
    pcVar2 = pQVar7[-1].local_name.d.ptr;
    pQVar7[-1].local_name.d.ptr = pQVar9[-1].local_name.d.ptr;
    pQVar9[-1].local_name.d.ptr = pcVar2;
    qVar3 = pQVar7[-1].local_name.d.size;
    pQVar7[-1].local_name.d.size = pQVar9[-1].local_name.d.size;
    pQVar9[-1].local_name.d.size = qVar3;
    ((d_first.current)->real_name).d.d = ((d_first.current)->real_name).d.d + -3;
    pQVar9 = (QMakeLocalFileName *)(((first.current)->real_name).d.d + -3);
    ((first.current)->real_name).d.d = (Data *)pQVar9;
    pQVar7 = (QMakeLocalFileName *)((d_first.current)->real_name).d.d;
  }
  while (pQVar9 != pQVar8) {
    ((first.current)->real_name).d.d = (Data *)(pQVar9 + 1);
    pDVar4 = (pQVar9->local_name).d.d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pQVar9->local_name).d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar5 = *(int **)&(pQVar9->real_name).d.d;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pQVar9->real_name).d.d,2,0x10);
      }
    }
    pQVar9 = (QMakeLocalFileName *)((first.current)->real_name).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QMakeLocalFileName_*>,_long_long>::Destructor
  ::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}